

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

void __thiscall VkSpecParser::parseCommands(VkSpecParser *this)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QStringView QVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  undefined1 auVar7 [16];
  Command c;
  Command local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QXmlStreamReader::atEnd();
  if (cVar1 == '\0') {
    do {
      QXmlStreamReader::readNext();
      iVar2 = QXmlStreamReader::tokenType();
      if (iVar2 == 5) {
        auVar7 = QXmlStreamReader::name();
        if (auVar7._0_8_ == 8) {
          QVar3.m_data = auVar7._8_8_;
          QVar3.m_size = 8;
          QVar5.m_data = L"commands";
          QVar5.m_size = 8;
          cVar1 = QtPrivate::equalStrings(QVar3,QVar5);
          if (cVar1 != '\0') break;
        }
      }
      iVar2 = QXmlStreamReader::tokenType();
      if (iVar2 == 4) {
        auVar7 = QXmlStreamReader::name();
        if (auVar7._0_8_ == 7) {
          QVar4.m_data = auVar7._8_8_;
          QVar4.m_size = 7;
          QVar6.m_data = L"command";
          QVar6.m_size = 7;
          cVar1 = QtPrivate::equalStrings(QVar4,QVar6);
          if (cVar1 != '\0') {
            local_a8.deviceLevel = true;
            local_a8._97_7_ = 0xaaaaaaaaaaaaaa;
            local_a8.args.d.ptr = (TypedName *)0xaaaaaaaaaaaaaaaa;
            local_a8.args.d.size = -0x5555555555555556;
            local_a8.cmd.typeSuffix.d.size = -0x5555555555555556;
            local_a8.args.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_a8.cmd.typeSuffix.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_a8.cmd.typeSuffix.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_a8.cmd.type.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_a8.cmd.type.d.size = -0x5555555555555556;
            local_a8.cmd.name.d.size = -0x5555555555555556;
            local_a8.cmd.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_a8.cmd.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_a8.cmd.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            parseCommand(&local_a8,this);
            if (local_a8.cmd.name.d.size != 0) {
              QtPrivate::QGenericArrayOps<VkSpecParser::Command>::
              emplace<VkSpecParser::Command_const&>
                        ((QGenericArrayOps<VkSpecParser::Command> *)&this->m_commands,
                         (this->m_commands).d.size,&local_a8);
              QList<VkSpecParser::Command>::end(&this->m_commands);
            }
            QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(&local_a8.args.d);
            if (&(local_a8.cmd.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.cmd.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((local_a8.cmd.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_a8.cmd.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_a8.cmd.typeSuffix.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_a8.cmd.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.cmd.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_a8.cmd.type.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_a8.cmd.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_a8.cmd.type.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_a8.cmd.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.cmd.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_a8.cmd.name.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_a8.cmd.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                  ._M_i == 0) {
                QArrayData::deallocate(&(local_a8.cmd.name.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
      }
      cVar1 = QXmlStreamReader::atEnd();
    } while (cVar1 == '\0');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseCommands()
{
    // <commands comment="Vulkan command definitions">
    //   <command successcodes="VK_SUCCESS" ...>

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("commands"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("command")) {
            const Command c = parseCommand();
            if (!c.cmd.name.isEmpty()) // skip aliases and commands for another api
                m_commands.append(c);
        }
    }
}